

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O1

string * __thiscall
soul::Program::ProgramImpl::getFunctionNameWithQualificationIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,Module *context,Function *f)

{
  string *psVar1;
  pointer pcVar2;
  Module *in_RAX;
  pool_ptr<soul::Module> m;
  Module *local_28;
  
  local_28 = in_RAX;
  findModuleContainingFunction((ProgramImpl *)&local_28,(Function *)this);
  if (local_28 != (Module *)0x0) {
    if (local_28 == context) {
      psVar1 = (f->name).name;
      if (psVar1 == (string *)0x0) {
        throwInternalCompilerError("isValid()","toString",0x23);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (psVar1->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar1->_M_string_length);
    }
    else {
      if (local_28 == (Module *)0x0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      psVar1 = (f->name).name;
      if (psVar1 == (string *)0x0) {
        throwInternalCompilerError("isValid()","operator const std::basic_string<char> &",0x21);
      }
      TokenisedPathString::join(__return_storage_ptr__,&local_28->fullName,psVar1);
    }
    if (local_28 != (Module *)0x0) {
      return __return_storage_ptr__;
    }
  }
  throwInternalCompilerError("getFunctionNameWithQualificationIfNeeded",0xd4);
}

Assistant:

std::string getFunctionNameWithQualificationIfNeeded (const Module& context, const heart::Function& f) const
    {
        if (auto m = findModuleContainingFunction (f))
        {
            if (m == std::addressof (context))
                return f.name.toString();

            return TokenisedPathString::join (m->fullName, f.name);
        }

        SOUL_ASSERT_FALSE;
        return f.name;
    }